

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *pXVar1;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_308;
  xml_output local_2f0;
  xml_output local_2b8;
  xml_output local_280;
  xml_output local_248;
  xml_output local_210;
  xml_output local_1d8;
  xml_output local_1a0;
  xml_output local_168;
  xml_output local_130;
  xml_output local_f8;
  xml_output local_c0;
  QArrayDataPointer<char16_t> local_88;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_88,"Lib");
  tag(&local_70,(QString *)&local_88);
  pXVar1 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  attrTagX(&local_c0,"AdditionalDependencies",(QStringList *)((long)__buf + 8),";");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_c0);
  attrTagX(&local_f8,"AdditionalLibraryDirectories",(QStringList *)((long)__buf + 0x20),";");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_f8);
  attrTagX(&local_130,"AdditionalOptions",(QStringList *)((long)__buf + 0x38)," ");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_130);
  attrTagX(&local_168,"ExportNamedFunctions",(QStringList *)((long)__buf + 0x50),";");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_168);
  attrTagX(&local_1a0,"ForceSymbolReferences",(QStringList *)((long)__buf + 0x68),";");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_1a0);
  attrTagT(&local_1d8,"IgnoreAllDefaultLibraries",*(triState *)((long)__buf + 0x80));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_1d8);
  attrTagX(&local_210,"IgnoreSpecificDefaultLibraries",(QStringList *)((long)__buf + 0x88),";");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_210);
  attrTagS(&local_248,"ModuleDefinitionFile",(QString *)((long)__buf + 0xa0));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_248);
  attrTagS(&local_280,"OutputFile",(QString *)((long)__buf + 0xb8));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_280);
  attrTagT(&local_2b8,"SuppressStartupBanner",*(triState *)((long)__buf + 0xd0));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_2b8);
  QString::QString((QString *)&QStack_308,"Lib");
  closetag(&local_2f0,(QString *)&QStack_308);
  XmlOutput::operator<<(pXVar1,&local_2f0);
  XmlOutput::xml_output::~xml_output(&local_2f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_308);
  XmlOutput::xml_output::~xml_output(&local_2b8);
  XmlOutput::xml_output::~xml_output(&local_280);
  XmlOutput::xml_output::~xml_output(&local_248);
  XmlOutput::xml_output::~xml_output(&local_210);
  XmlOutput::xml_output::~xml_output(&local_1d8);
  XmlOutput::xml_output::~xml_output(&local_1a0);
  XmlOutput::xml_output::~xml_output(&local_168);
  XmlOutput::xml_output::~xml_output(&local_130);
  XmlOutput::xml_output::~xml_output(&local_f8);
  XmlOutput::xml_output::~xml_output(&local_c0);
  XmlOutput::xml_output::~xml_output(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCLibrarianTool &tool)
{
    xml
        << tag(_Lib)
            << attrTagX(_AdditionalDependencies, tool.AdditionalDependencies, ";")
            << attrTagX(_AdditionalLibraryDirectories, tool.AdditionalLibraryDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagX(_ExportNamedFunctions, tool.ExportNamedFunctions, ";")
            << attrTagX(_ForceSymbolReferences, tool.ForceSymbolReferences, ";")
            << attrTagT(_IgnoreAllDefaultLibraries, tool.IgnoreAllDefaultLibraries)
            << attrTagX(_IgnoreSpecificDefaultLibraries, tool.IgnoreDefaultLibraryNames, ";")
            << attrTagS(_ModuleDefinitionFile, tool.ModuleDefinitionFile)
            << attrTagS(_OutputFile, tool.OutputFile)
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << closetag(_Lib);
}